

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::mln1p<float>(float x)

{
  int in_EDI;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar1;
  float delta;
  int n;
  float sign;
  float x_to_the_n;
  float y;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_4;
  
  Catch::clara::std::abs(in_EDI);
  if (extraout_XMM0_Da < 0.03125) {
    local_c = 0.0;
    local_10 = in_XMM0_Da * in_XMM0_Da;
    local_14 = 1.0;
    for (local_18 = 2; local_18 < 0x18; local_18 = local_18 + 1) {
      local_c = (local_14 * local_10) / (float)local_18 + local_c;
      Catch::clara::std::abs(in_EDI);
      fVar1 = Catch::clara::std::numeric_limits<float>::epsilon();
      if (extraout_XMM0_Da_00 < fVar1 * 4.0 * local_c) break;
      local_10 = in_XMM0_Da * local_10;
      local_14 = -local_14;
    }
    local_4 = local_c;
  }
  else {
    local_4 = ln1p(0.0);
    local_4 = in_XMM0_Da - local_4;
  }
  return local_4;
}

Assistant:

TRNG_CUDA_ENABLE T mln1p(T x) {
        if (abs(x) >= T(1) / T(32))
          return x - ln1p(x);
        // use Taylor expansion for small arguments
        T y{0};
        T x_to_the_n{x * x};
        T sign{1};
        for (int n{2}; n < numeric_limits<T>::digits; ++n) {
          const T delta{sign * x_to_the_n / n};
          y += delta;
          if (abs(delta) < 4 * numeric_limits<T>::epsilon() * y)
            break;
          x_to_the_n *= x;
          sign = -sign;
        }
        return y;
      }